

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plannerbase.cpp
# Opt level: O2

Option * __thiscall
despot::PlannerBase::InitializeParamers
          (PlannerBase *this,int argc,char **argv,string *solver_type,bool *search_solver,
          int *num_runs,string *world_type,string *belief_type,int *time_limit)

{
  long lVar1;
  undefined8 *puVar2;
  uint seed;
  char *pcVar3;
  Option *options;
  Option *buffer;
  ostream *poVar4;
  long lVar5;
  PlannerBase *this_00;
  ulong uVar6;
  int argc_00;
  Random local_54;
  Stats stats;
  Parser parse;
  
  EvalLog::curr_inst_start_time = get_time_second();
  if (argc < 1) {
    pcVar3 = "despot";
  }
  else {
    pcVar3 = *argv;
  }
  argc_00 = argc - (uint)(0 < argc);
  option::Stats::Stats(&stats,this->usage,argc_00,argv + (0 < argc_00),0,false);
  uVar6 = (ulong)stats.options_max * 0x30;
  options = (Option *)operator_new__(uVar6);
  if ((ulong)stats.options_max != 0) {
    lVar5 = 0;
    do {
      lVar1 = (long)&options->next_ + lVar5 + 1;
      puVar2 = (undefined8 *)((long)&options->name + lVar5 + 4);
      *puVar2 = 0;
      puVar2[1] = 0;
      puVar2 = (undefined8 *)((long)&options->desc + lVar5);
      *puVar2 = 0;
      puVar2[1] = 0;
      *(long *)((long)&options->prev_ + lVar5) = lVar1;
      *(long *)((long)&options->next_ + lVar5) = lVar1;
      lVar5 = lVar5 + 0x30;
    } while (uVar6 - lVar5 != 0);
  }
  uVar6 = (ulong)stats.buffer_max * 0x30;
  buffer = (Option *)operator_new__(uVar6);
  if ((ulong)stats.buffer_max != 0) {
    lVar5 = 0;
    do {
      lVar1 = (long)&buffer->next_ + lVar5 + 1;
      puVar2 = (undefined8 *)((long)&buffer->name + lVar5 + 4);
      *puVar2 = 0;
      puVar2[1] = 0;
      puVar2 = (undefined8 *)((long)&buffer->desc + lVar5);
      *puVar2 = 0;
      puVar2[1] = 0;
      *(long *)((long)&buffer->prev_ + lVar5) = lVar1;
      *(long *)((long)&buffer->next_ + lVar5) = lVar1;
      lVar5 = lVar5 + 0x30;
    } while (uVar6 - lVar5 != 0);
  }
  option::Parser::Parser(&parse,this->usage,argc_00,argv + (0 < argc_00),options,buffer,0,false,-1);
  this_00 = this;
  (*this->_vptr_PlannerBase[4])();
  if (options[1].desc == (Descriptor *)0x0) {
    OptionParse(this_00,options,num_runs,world_type,belief_type,time_limit,solver_type,search_solver
               );
    Seeds::root_seed(DAT_0019fdf0);
    seed = Seeds::Next();
    Random::Random(&local_54,seed);
    Random::RANDOM = local_54.seed_;
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"Usage: ");
    poVar4 = std::operator<<(poVar4,pcVar3);
    poVar4 = std::operator<<(poVar4," [options]");
    std::endl<char,std::char_traits<char>>(poVar4);
    option::printUsage<std::ostream>
              ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,this->usage,0x50,0x32,0x4b
              );
    options = (Option *)0x0;
  }
  return options;
}

Assistant:

option::Option* PlannerBase::InitializeParamers(int argc, char *argv[],
		std::string& solver_type, bool& search_solver, int& num_runs,
		std::string& world_type, std::string& belief_type, int& time_limit) {
	EvalLog::curr_inst_start_time = get_time_second();

	const char *program = (argc > 0) ? argv[0] : "despot";

	argc -= (argc > 0);
	argv += (argc > 0); // skip program name argv[0] if present

	option::Stats stats(usage, argc, argv);
	option::Option *options = new option::Option[stats.options_max];
	option::Option *buffer = new option::Option[stats.buffer_max];
	option::Parser parse(usage, argc, argv, options, buffer);

	/* =========================================
	 * Problem specific default parameter values
	 *=========================================*/
	InitializeDefaultParameters();

	/* =========================
	 * Parse optional parameters
	 * =========================*/
	if (options[E_HELP]) {
		cout << "Usage: " << program << " [options]" << endl;
		option::printUsage(std::cout, usage);
		return NULL;
	}
	OptionParse(options, num_runs, world_type, belief_type, time_limit,
			solver_type, search_solver);

	/* =========================
	 * Global random generator
	 * =========================*/
	Seeds::root_seed(Globals::config.root_seed);
	//unsigned world_seed = Seeds::Next();
	unsigned seed = Seeds::Next();
	Random::RANDOM = Random(seed);

	return options;
}